

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O1

bool option::Parser::workhorse
               (bool gnu,Descriptor *usage,int numargs,char **args,Action *action,
               bool single_minus_longopt,bool print_errors,int min_abbr_len)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  Descriptor *pDVar5;
  ulong uVar6;
  byte bVar7;
  ArgStatus AVar8;
  int iVar9;
  int iVar10;
  char *temp_1;
  char **ppcVar11;
  ulong uVar12;
  char **ppcVar13;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  ulong uVar17;
  Descriptor *ctx;
  char *pcVar18;
  char *st2;
  char **ppcVar19;
  bool bVar20;
  bool bVar21;
  Option option;
  int local_b4;
  Option local_60;
  
  if (numargs == 0 || args == (char **)0x0) {
    iVar10 = 0;
    local_b4 = 0;
  }
  else {
    ppcVar11 = &usage->longopt;
    iVar10 = 0;
    do {
      pcVar16 = *args;
      local_b4 = numargs;
      if (pcVar16 == (char *)0x0) goto LAB_0010e6c2;
      if (*pcVar16 == '-') {
        cVar2 = pcVar16[1];
        if (cVar2 == '-') {
          if (pcVar16[2] == '\0') {
            if (0 < iVar10) {
              pcVar16 = *args;
              lVar14 = 0;
              do {
                args[lVar14] = args[lVar14 + -1];
                args[lVar14 + -1] = pcVar16;
                lVar14 = lVar14 + -1;
              } while (-iVar10 < lVar14);
            }
            args = args + 1;
            local_b4 = numargs - (uint)(0 < numargs);
            bVar7 = 3;
            goto LAB_0010e668;
          }
        }
        else if (cVar2 == '\0') goto LAB_0010e269;
        bVar20 = cVar2 != '-';
        st2 = pcVar16 + 2;
        if (bVar20) {
          st2 = pcVar16 + 1;
        }
        bVar4 = single_minus_longopt;
        do {
          if ((bVar20) && ((bVar4 & 1) == 0)) {
            uVar17 = 0;
LAB_0010e446:
            pcVar18 = (char *)0x0;
          }
          else {
            pcVar15 = usage->longopt;
            bVar21 = pcVar15 == (char *)0x0;
            if (bVar21) {
              uVar17 = 0;
            }
            else {
              uVar17 = 0;
              uVar12 = 0;
              do {
                lVar14 = 0;
                do {
                  pcVar18 = pcVar15 + lVar14;
                  if (*pcVar18 == '\0') {
                    if ((st2[lVar14] == '\0') || (st2[lVar14] == '=')) {
                      uVar17 = uVar12 & 0xffffffff;
                      goto LAB_0010e346;
                    }
                    break;
                  }
                  pcVar1 = st2 + lVar14;
                  lVar14 = lVar14 + 1;
                } while (*pcVar18 == *pcVar1);
                uVar17 = (ulong)((int)uVar17 + 1);
                pcVar15 = usage[uVar12 + 1].longopt;
                bVar21 = pcVar15 == (char *)0x0;
                uVar12 = uVar12 + 1;
              } while (!bVar21);
            }
LAB_0010e346:
            if ((0 < min_abbr_len) && (bVar21)) {
              uVar12 = 0;
              ppcVar19 = ppcVar11;
              if ((*ppcVar11 != (char *)0x0) &&
                 (bVar21 = streqabbr(*ppcVar11,st2,(ulong)(uint)min_abbr_len), !bVar21)) {
                uVar6 = 1;
                ppcVar13 = &usage[1].longopt;
                do {
                  ppcVar19 = ppcVar13;
                  uVar12 = uVar6;
                  if (*ppcVar19 == (char *)0x0) break;
                  bVar21 = streqabbr(*ppcVar19,st2,(ulong)(uint)min_abbr_len);
                  uVar6 = (ulong)((int)uVar12 + 1);
                  ppcVar13 = ppcVar19 + 5;
                } while (!bVar21);
              }
              if (*ppcVar19 != (char *)0x0) {
                ppcVar19 = &usage[1].longopt + uVar12 * 5;
                do {
                  ppcVar13 = ppcVar19;
                  if (*ppcVar13 == (char *)0x0) break;
                  bVar21 = streqabbr(*ppcVar13,st2,(ulong)(uint)min_abbr_len);
                  ppcVar19 = ppcVar13 + 5;
                } while (!bVar21);
                if (*ppcVar13 == (char *)0x0) {
                  uVar17 = uVar12;
                }
              }
            }
            pcVar15 = st2;
            if (usage[(int)uVar17].longopt != (char *)0x0) {
              bVar20 = false;
            }
            do {
              pcVar18 = pcVar15 + 1;
              cVar2 = *pcVar15;
              if (cVar2 == '\0') {
                if (numargs == 1) {
                  bVar4 = 0;
                  goto LAB_0010e446;
                }
                pcVar18 = args[1];
                break;
              }
              pcVar15 = pcVar18;
            } while (cVar2 != '=');
            bVar4 = 0;
          }
          pcVar15 = pcVar16;
          if (bVar20) {
            pcVar15 = pcVar16 + 1;
            cVar2 = pcVar16[1];
            if (cVar2 != '\0') {
              pcVar18 = usage->shortopt;
              uVar17 = 0;
              while (pcVar18 != (char *)0x0) {
                do {
                  cVar3 = *pcVar18;
                  if (cVar3 == '\0') break;
                  pcVar18 = pcVar18 + 1;
                } while (cVar3 != cVar2);
                if (cVar3 == cVar2) break;
                pcVar18 = usage[uVar17 + 1].shortopt;
                uVar17 = uVar17 + 1;
              }
              pcVar18 = pcVar16 + 2;
              if (pcVar16[2] == '\0') {
                pcVar18 = (char *)0x0;
              }
              if ((numargs != 1) && (pcVar16[2] == '\0')) {
                pcVar18 = args[1];
              }
              goto LAB_0010e4c3;
            }
            bVar7 = 4;
          }
          else {
LAB_0010e4c3:
            if (usage[(int)uVar17].shortopt == (char *)0x0) {
              pcVar16 = usage->shortopt;
              ctx = usage;
              while (pcVar16 != (char *)0x0) {
                if ((*pcVar16 == '\0') && (*ctx->longopt == '\0')) goto LAB_0010e50b;
                pDVar5 = ctx + 1;
                ctx = ctx + 1;
                pcVar16 = pDVar5->shortopt;
              }
              ctx = (Descriptor *)0x0;
            }
            else {
              ctx = usage + (int)uVar17;
            }
LAB_0010e50b:
            if (ctx == (Descriptor *)0x0) {
              bVar7 = 0;
            }
            else {
              Option::init(&local_60,(EVP_PKEY_CTX *)ctx);
              AVar8 = (*ctx->check_arg)(&local_60,print_errors);
              switch(AVar8) {
              case ARG_NONE:
              case ARG_IGNORE:
                local_60.arg = (char *)0x0;
                break;
              case ARG_OK:
                if (((numargs != 1) && (pcVar18 != (char *)0x0)) && (pcVar18 == args[1])) {
                  if (0 < iVar10) {
                    pcVar16 = *args;
                    lVar14 = 0;
                    do {
                      args[lVar14] = args[lVar14 + -1];
                      args[lVar14 + -1] = pcVar16;
                      lVar14 = lVar14 + -1;
                    } while (-iVar10 < lVar14);
                  }
                  args = args + 1;
                  local_b4 = local_b4 - (uint)(0 < local_b4);
                }
                bVar20 = false;
                break;
              case ARG_ILLEGAL:
                bVar7 = 1;
                goto LAB_0010e607;
              }
              iVar9 = (**action->_vptr_Action)();
              bVar7 = (byte)iVar9 ^ 1;
            }
          }
LAB_0010e607:
          if (bVar7 != 0) {
            if (bVar7 != 4) goto LAB_0010e668;
            break;
          }
          pcVar16 = pcVar15;
        } while (bVar20);
        if (0 < iVar10) {
          pcVar16 = *args;
          lVar14 = 0;
          do {
            args[lVar14] = args[lVar14 + -1];
            args[lVar14 + -1] = pcVar16;
            lVar14 = lVar14 + -1;
          } while (-iVar10 < lVar14);
        }
        args = args + 1;
        local_b4 = local_b4 - (uint)(0 < local_b4);
        bVar7 = 0;
      }
      else {
LAB_0010e269:
        bVar7 = 3;
        if (gnu) {
          iVar10 = iVar10 + 1;
          args = args + 1;
          local_b4 = numargs - (uint)(0 < numargs);
          bVar7 = 2;
        }
      }
LAB_0010e668:
      if ((bVar7 != 0) && (bVar7 != 2)) {
        if (bVar7 != 3) {
          return false;
        }
        goto LAB_0010e6c2;
      }
      numargs = local_b4;
    } while (local_b4 != 0);
    local_b4 = 0;
  }
LAB_0010e6c2:
  if ((0 < local_b4) && (*args == (char *)0x0)) {
    local_b4 = 0;
  }
  if (local_b4 < 0) {
    local_b4 = -1;
    ppcVar11 = args;
    do {
      local_b4 = local_b4 + 1;
      pcVar16 = *ppcVar11;
      ppcVar11 = ppcVar11 + 1;
    } while (pcVar16 != (char *)0x0);
  }
  iVar10 = (*action->_vptr_Action[1])(action,(ulong)(uint)(local_b4 + iVar10),args + -(long)iVar10);
  return (bool)(char)iVar10;
}

Assistant:

inline bool Parser::workhorse(bool gnu, const Descriptor usage[], int numargs, const char** args, Action& action,
                              bool single_minus_longopt, bool print_errors, int min_abbr_len)
{
  // protect against NULL pointer
  if (args == 0)
    numargs = 0;

  int nonops = 0;

  while (numargs != 0 && *args != 0)
  {
    const char* param = *args; // param can be --long-option, -srto or non-option argument

    // in POSIX mode the first non-option argument terminates the option list
    // a lone minus character is a non-option argument
    if (param[0] != '-' || param[1] == 0)
    {
      if (gnu)
      {
        ++nonops;
        ++args;
        if (numargs > 0)
          --numargs;
        continue;
      }
      else
        break;
    }

    // -- terminates the option list. The -- itself is skipped.
    if (param[1] == '-' && param[2] == 0)
    {
      shift(args, nonops);
      ++args;
      if (numargs > 0)
        --numargs;
      break;
    }

    bool handle_short_options;
    const char* longopt_name;
    if (param[1] == '-') // if --long-option
    {
      handle_short_options = false;
      longopt_name = param + 2;
    }
    else
    {
      handle_short_options = true;
      longopt_name = param + 1; //for testing a potential -long-option
    }

    bool try_single_minus_longopt = single_minus_longopt;
    bool have_more_args = (numargs > 1 || numargs < 0); // is referencing argv[1] valid?

    do // loop over short options in group, for long options the body is executed only once
    {
      int idx = 0;

      const char* optarg = 0;

      /******************** long option **********************/
      if (handle_short_options == false || try_single_minus_longopt)
      {
        idx = 0;
        while (usage[idx].longopt != 0 && !streq(usage[idx].longopt, longopt_name))
          ++idx;

        if (usage[idx].longopt == 0 && min_abbr_len > 0) // if we should try to match abbreviated long options
        {
          int i1 = 0;
          while (usage[i1].longopt != 0 && !streqabbr(usage[i1].longopt, longopt_name, min_abbr_len))
            ++i1;
          if (usage[i1].longopt != 0)
          { // now test if the match is unambiguous by checking for another match
            int i2 = i1 + 1;
            while (usage[i2].longopt != 0 && !streqabbr(usage[i2].longopt, longopt_name, min_abbr_len))
              ++i2;

            if (usage[i2].longopt == 0) // if there was no second match it's unambiguous, so accept i1 as idx
              idx = i1;
          }
        }

        // if we found something, disable handle_short_options (only relevant if single_minus_longopt)
        if (usage[idx].longopt != 0)
          handle_short_options = false;

        try_single_minus_longopt = false; // prevent looking for longopt in the middle of shortopt group

        optarg = longopt_name;
        while (*optarg != 0 && *optarg != '=')
          ++optarg;
        if (*optarg == '=') // attached argument
          ++optarg;
        else
          // possibly detached argument
          optarg = (have_more_args ? args[1] : 0);
      }

      /************************ short option ***********************************/
      if (handle_short_options)
      {
        if (*++param == 0) // point at the 1st/next option character
          break; // end of short option group

        idx = 0;
        while (usage[idx].shortopt != 0 && !instr(*param, usage[idx].shortopt))
          ++idx;

        if (param[1] == 0) // if the potential argument is separate
          optarg = (have_more_args ? args[1] : 0);
        else
          // if the potential argument is attached
          optarg = param + 1;
      }

      const Descriptor* descriptor = &usage[idx];

      if (descriptor->shortopt == 0) /**************  unknown option ********************/
      {
        // look for dummy entry (shortopt == "" and longopt == "") to use as Descriptor for unknown options
        idx = 0;
        while (usage[idx].shortopt != 0 && (usage[idx].shortopt[0] != 0 || usage[idx].longopt[0] != 0))
          ++idx;
        descriptor = (usage[idx].shortopt == 0 ? 0 : &usage[idx]);
      }

      if (descriptor != 0)
      {
        Option option(descriptor, param, optarg);
        switch (descriptor->check_arg(option, print_errors))
        {
          case ARG_ILLEGAL:
            return false; // fatal
          case ARG_OK:
            // skip one element of the argument vector, if it's a separated argument
            if (optarg != 0 && have_more_args && optarg == args[1])
            {
              shift(args, nonops);
              if (numargs > 0)
                --numargs;
              ++args;
            }

            // No further short options are possible after an argument
            handle_short_options = false;

            break;
          case ARG_IGNORE:
          case ARG_NONE:
            option.arg = 0;
            break;
        }

        if (!action.perform(option))
          return false;
      }

    } while (handle_short_options);

    shift(args, nonops);
    ++args;
    if (numargs > 0)
      --numargs;

  } // while

  if (numargs > 0 && *args == 0) // It's a bug in the caller if numargs is greater than the actual number
    numargs = 0; // of arguments, but as a service to the user we fix this if we spot it.

  if (numargs < 0) // if we don't know the number of remaining non-option arguments
  { // we need to count them
    numargs = 0;
    while (args[numargs] != 0)
      ++numargs;
  }

  return action.finished(numargs + nonops, args - nonops);
}